

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_X509.cpp
# Opt level: O2

bool __thiscall axl::cry::X509Cert::loadDer(X509Cert *this,void *p0,size_t size)

{
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> HVar1;
  X509 *pXVar2;
  uchar **in;
  X509 *cert;
  uchar_t *p;
  Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_> local_30;
  uchar *local_28;
  
  sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::close
            (&this->super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>,(int)p0);
  in = &local_28;
  local_28 = (uchar *)p0;
  local_30.m_h = (x509_st *)X509_new();
  pXVar2 = d2i_X509((X509 **)&local_30,in,size);
  HVar1.m_h = local_30.m_h;
  if (pXVar2 == (X509 *)0x0) {
    setLastCryptoError();
  }
  else {
    sl::Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>::close
              (&this->super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>,(int)in
              );
    (this->super_Handle<x509_st_*,_axl::cry::FreeX509,_axl::sl::Zero<x509_st_*>_>).m_h = HVar1.m_h;
  }
  return pXVar2 != (X509 *)0x0;
}

Assistant:

bool
X509Cert::loadDer(
	const void* p0,
	size_t size
) {
	close();

	const uchar_t* p = (uchar_t*)p0;
	X509* cert = X509_new();
	X509* result = d2i_X509(&cert, &p, size);
	if (!result) {
		ASSERT(cert == NULL); // should have been freed already
		return failWithLastCryptoError();
	}

	attach(cert);
	return true;
}